

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O3

int Fra_Claus(Aig_Man_t *pAig,int nFrames,int nPref,int nClausesMax,int nLutSize,int nLevels,
             int nCutsMax,int nBatches,int fStepUp,int fBmc,int fRefs,int fTarget,int fVerbose,
             int fVeryVerbose)

{
  int iVar1;
  int iVar2;
  Clu_Man_t *p;
  Cnf_Dat_t *p_00;
  sat_solver *psVar3;
  long lVar4;
  long lVar5;
  int level;
  char *pcVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  int local_68;
  timespec ts;
  long local_40;
  
  iVar1 = clock_gettime(3,(timespec *)&ts);
  if (iVar1 < 0) {
    local_40 = -1;
  }
  else {
    local_40 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
  }
  p = Fra_ClausAlloc(pAig,nFrames,nPref,nClausesMax,nLutSize,nLevels,nCutsMax,nBatches,fStepUp,
                     fTarget,fVerbose,fVeryVerbose);
  if (p->fVerbose != 0) {
    printf("PARAMETERS: Frames = %d. Pref = %d. Clauses max = %d. Cut size = %d.\n",
           (ulong)(uint)nFrames,(ulong)(uint)nPref,(ulong)(uint)nClausesMax,(ulong)(uint)nLutSize);
    pcVar6 = "yes";
    if (fStepUp == 0) {
      pcVar6 = "no";
    }
    printf("Level max = %d. Cuts max = %d. Batches = %d. Increment cut size = %s.\n",
           (ulong)(uint)nLevels,(ulong)(uint)nCutsMax,(ulong)(uint)nBatches,pcVar6);
  }
  local_68 = p->fTarget;
  if ((local_68 != 0) && (pAig->nObjs[3] - pAig->nRegs != 1)) {
    __assert_fail("!p->fTarget || Aig_ManCoNum(pAig) - Aig_ManRegNum(pAig) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraClaus.c"
                  ,0x6a2,
                  "int Fra_Claus(Aig_Man_t *, int, int, int, int, int, int, int, int, int, int, int, int, int)"
                 );
  }
  clock_gettime(3,(timespec *)&ts);
  p_00 = Cnf_DeriveSimple(p->pAig,p->pAig->nObjs[3]);
  p->pCnf = p_00;
  clock_gettime(3,(timespec *)&ts);
  iVar1 = p->nFrames;
  uVar8 = p->nPref + iVar1;
  psVar3 = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,uVar8,1);
  p->pSatBmc = psVar3;
  if (psVar3 == (sat_solver *)0x0) {
    pcVar6 = "Error: BMC solver is unsat.";
  }
  else {
    if ((local_68 != 0) && (iVar2 = Fra_ClausRunBmc(p), iVar2 == 0)) {
      printf("Problem fails the base case after %d frame expansion.\n",(ulong)uVar8);
      goto LAB_00695c32;
    }
    clock_gettime(3,(timespec *)&ts);
    psVar3 = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,iVar1 + 1,0);
    p->pSatMain = psVar3;
    if (psVar3 != (sat_solver *)0x0) {
      if (0 < p->nBatches) {
        uVar8 = 0;
        do {
          uVar7 = uVar8 + 1;
          printf("*** BATCH %d:  ",(ulong)uVar7);
          if ((p->nLutSize < 0xc && uVar8 != 0) &&
             (((p->fFiltering == 0 || (p->fNothingNew != 0)) || (p->fStepUp != 0)))) {
            p->nLutSize = p->nLutSize + 1;
          }
          printf("Using %d-cuts.\n");
          if ((local_68 != 0) && (iVar1 = Fra_ClausRunSat(p), iVar1 != 0)) {
            pcVar6 = "Problem is inductive without strengthening.";
            goto LAB_00695be5;
          }
          clock_gettime(3,(timespec *)&ts);
          iVar1 = p->nPref;
          p->nPref = 0;
          p->nSimWordsPref = 0;
          Fra_ClausProcessClauses2(p,fRefs);
          p->nPref = iVar1;
          p->nSimWordsPref = (p->nSimWords * iVar1) / p->nSimFrames;
          if (fBmc != 0) {
            iVar1 = clock_gettime(3,(timespec *)&ts);
            if (iVar1 < 0) {
              lVar4 = 1;
            }
            else {
              lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
              lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + ts.tv_sec * -1000000;
            }
            uVar8 = Fra_ClausBmcClauses(p);
            p->nClauses = p->nClauses - uVar8;
            if (fVerbose != 0) {
              iVar1 = 0xa1c0d7;
              printf("BMC disproved %d clauses.  ",(ulong)uVar8);
              Abc_Print(iVar1,"%s =","Time");
              iVar2 = 3;
              iVar1 = clock_gettime(3,(timespec *)&ts);
              if (iVar1 < 0) {
                lVar5 = -1;
              }
              else {
                lVar5 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
              }
              Abc_Print(iVar2,"%9.2f sec\n",(double)(lVar5 + lVar4) / 1000000.0);
            }
          }
          iVar1 = clock_gettime(3,(timespec *)&ts);
          if (iVar1 < 0) {
            lVar4 = 1;
          }
          else {
            lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
            lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + ts.tv_sec * -1000000;
          }
          uVar9 = 0;
          do {
            if (fVerbose != 0) {
              printf("Iter %3d : Begin = %5d. ",uVar9,(ulong)(uint)p->nClauses);
            }
            iVar1 = Fra_ClausInductiveClauses(p);
            if (0 < iVar1) {
              p->nClauses = p->nClauses - iVar1;
            }
            if (fVerbose != 0) {
              iVar2 = 0xa1c10c;
              printf("End = %5d. Exs = %5d.  ",(ulong)(uint)p->nClauses,(ulong)(uint)p->nCexes);
              Abc_Print(iVar2,"%s =","Time");
              level = 3;
              iVar2 = clock_gettime(3,(timespec *)&ts);
              if (iVar2 < 0) {
                lVar5 = -1;
              }
              else {
                lVar5 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
              }
              Abc_Print(level,"%9.2f sec\n",(double)(lVar5 + lVar4) / 1000000.0);
            }
            iVar2 = clock_gettime(3,(timespec *)&ts);
            if (iVar2 < 0) {
              lVar4 = 1;
            }
            else {
              lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
              lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + ts.tv_sec * -1000000;
            }
            uVar9 = (ulong)((int)uVar9 + 1);
          } while (0 < iVar1);
          Fra_ClausAddToStorage(p);
          local_68 = p->fTarget;
          if (local_68 == 0) {
            iVar1 = 0xa1c1a0;
            printf("Finished proving inductive clauses. ");
            Abc_Print(iVar1,"%s =","Time  ");
            iVar2 = 3;
            iVar1 = clock_gettime(3,(timespec *)&ts);
            if (iVar1 < 0) {
              lVar4 = -1;
            }
            else {
              lVar4 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
            }
            Abc_Print(iVar2,"%9.2f sec\n",(double)(lVar4 - local_40) / 1000000.0);
          }
          else {
            pcVar6 = "Fra_Claus(): Internal error.  ";
            if ((iVar1 != -1) && (pcVar6 = "Property FAILS during refinement.  ", p->fFail == 0)) {
              pcVar6 = "Property HOLDS inductively after strengthening.  ";
            }
            printf(pcVar6);
            Abc_Print((int)pcVar6,"%s =","Time  ");
            iVar2 = 3;
            iVar1 = clock_gettime(3,(timespec *)&ts);
            if (iVar1 < 0) {
              lVar4 = -1;
            }
            else {
              lVar4 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
            }
            Abc_Print(iVar2,"%9.2f sec\n",(double)(lVar4 - local_40) / 1000000.0);
            if (p->fFail == 0) {
              local_68 = 1;
              break;
            }
          }
          uVar8 = uVar7;
        } while ((int)uVar7 < p->nBatches);
      }
      Fra_InvariantVerify(pAig,nFrames,p->vClausesProven,p->vLitsProven);
      if (p->fVerbose != 0) {
        Fra_ClausPrintIndClauses(p);
        Fra_ClausEstimateCoverage(p);
      }
      if (local_68 == 0) {
        Fra_ClausWriteIndClauses(p);
      }
      goto LAB_00695c32;
    }
    pcVar6 = "Error: Main solver is unsat.";
  }
LAB_00695be5:
  puts(pcVar6);
LAB_00695c32:
  Fra_ClausFree(p);
  return 1;
}

Assistant:

int Fra_Claus( Aig_Man_t * pAig, int nFrames, int nPref, int nClausesMax, int nLutSize, int nLevels, int nCutsMax, int nBatches, int fStepUp, int fBmc, int fRefs, int fTarget, int fVerbose, int fVeryVerbose )
{
    Clu_Man_t * p;
    abctime clk, clkTotal = Abc_Clock(), clkInd;
    int b, Iter, Counter, nPrefOld;
    int nClausesBeg = 0;

    // create the manager
    p = Fra_ClausAlloc( pAig, nFrames, nPref, nClausesMax, nLutSize, nLevels, nCutsMax, nBatches, fStepUp, fTarget, fVerbose, fVeryVerbose );
if ( p->fVerbose )
{
    printf( "PARAMETERS: Frames = %d. Pref = %d. Clauses max = %d. Cut size = %d.\n", nFrames, nPref, nClausesMax, nLutSize );
    printf( "Level max = %d. Cuts max = %d. Batches = %d. Increment cut size = %s.\n", nLevels, nCutsMax, nBatches, fStepUp? "yes":"no" );
//ABC_PRT( "Sim-seq", Abc_Clock() - clk );
}

    assert( !p->fTarget || Aig_ManCoNum(pAig) - Aig_ManRegNum(pAig) == 1 );

clk = Abc_Clock();
    // derive CNF
//    if ( p->fTarget )
//        p->pAig->nRegs++;
    p->pCnf = Cnf_DeriveSimple( p->pAig, Aig_ManCoNum(p->pAig) );
//    if ( p->fTarget )
//        p->pAig->nRegs--;
if ( fVerbose )
{
//ABC_PRT( "CNF    ", Abc_Clock() - clk );
}

    // check BMC
clk = Abc_Clock();
    p->pSatBmc = (sat_solver *)Cnf_DataWriteIntoSolver( p->pCnf, p->nPref + p->nFrames, 1 );
    if ( p->pSatBmc == NULL )
    {
        printf( "Error: BMC solver is unsat.\n" );
        Fra_ClausFree( p );
        return 1;
    } 
    if ( p->fTarget && !Fra_ClausRunBmc( p ) )
    {
        printf( "Problem fails the base case after %d frame expansion.\n", p->nPref + p->nFrames );
        Fra_ClausFree( p );
        return 1;
    }
if ( fVerbose )
{
//ABC_PRT( "SAT-bmc", Abc_Clock() - clk );
}

    // start the SAT solver
clk = Abc_Clock();
    p->pSatMain = (sat_solver *)Cnf_DataWriteIntoSolver( p->pCnf, p->nFrames+1, 0 );
    if ( p->pSatMain == NULL )
    {
        printf( "Error: Main solver is unsat.\n" );
        Fra_ClausFree( p );
        return 1;
    } 


    for ( b = 0; b < p->nBatches; b++ )
    {
//        if ( fVerbose )
        printf( "*** BATCH %d:  ", b+1 );
        if ( b && p->nLutSize < 12 && (!p->fFiltering || p->fNothingNew || p->fStepUp) )
            p->nLutSize++;
        printf( "Using %d-cuts.\n", p->nLutSize );

        // try solving without additional clauses
        if ( p->fTarget && Fra_ClausRunSat( p ) )
        {
            printf( "Problem is inductive without strengthening.\n" );
            Fra_ClausFree( p );
            return 1;
        }
        if ( fVerbose )
        {
//        ABC_PRT( "SAT-ind", Abc_Clock() - clk );
        }
 
        // collect the candidate inductive clauses using 4-cuts
        clk = Abc_Clock();
        nPrefOld = p->nPref; p->nPref = 0; p->nSimWordsPref = 0;
    //    Fra_ClausProcessClauses( p, fRefs );
        Fra_ClausProcessClauses2( p, fRefs );
        p->nPref = nPrefOld;
        p->nSimWordsPref = p->nPref*p->nSimWords/p->nSimFrames;
        nClausesBeg = p->nClauses;

    //ABC_PRT( "Clauses", Abc_Clock() - clk );


        // check clauses using BMC
        if ( fBmc ) 
        {
            clk = Abc_Clock();
            Counter = Fra_ClausBmcClauses( p );
            p->nClauses -= Counter;
            if ( fVerbose )
            {
                printf( "BMC disproved %d clauses.  ", Counter );
                ABC_PRT( "Time", Abc_Clock() - clk );
            }
        }


        // prove clauses inductively
        clkInd = clk = Abc_Clock();
        Counter = 1;
        for ( Iter = 0; Counter > 0; Iter++ )
        {
            if ( fVerbose )
            printf( "Iter %3d : Begin = %5d. ", Iter, p->nClauses );
            Counter = Fra_ClausInductiveClauses( p );
            if ( Counter > 0 )
               p->nClauses -= Counter;
            if ( fVerbose )
            {
            printf( "End = %5d. Exs = %5d.  ", p->nClauses, p->nCexes );
    //        printf( "\n" );
            ABC_PRT( "Time", Abc_Clock() - clk );
            }
            clk = Abc_Clock();
        }
        // add proved clauses to storage
        Fra_ClausAddToStorage( p );
        // report the results
        if ( p->fTarget )
        {
            if ( Counter == -1 )
                printf( "Fra_Claus(): Internal error.  " );
            else if ( p->fFail )
                printf( "Property FAILS during refinement.  " );
            else
                printf( "Property HOLDS inductively after strengthening.  " );
            ABC_PRT( "Time  ", Abc_Clock() - clkTotal );
            if ( !p->fFail )
                break;
        }
        else
        {
            printf( "Finished proving inductive clauses. " );
            ABC_PRT( "Time  ", Abc_Clock() - clkTotal );
        }
    }

    // verify the computed interpolant
    Fra_InvariantVerify( pAig, nFrames, p->vClausesProven, p->vLitsProven );
//    printf( "THIS COMMAND IS KNOWN TO HAVE A BUG!\n" );

//    if ( !p->fTarget && p->fVerbose )
    if ( p->fVerbose )
    {
        Fra_ClausPrintIndClauses( p );
        Fra_ClausEstimateCoverage( p );
    }

    if ( !p->fTarget )
    {
        Fra_ClausWriteIndClauses( p );
    }
/*
    // print the statistic into a file
    {
        FILE * pTable;
        assert( p->nBatches == 1 );
        pTable = fopen( "stats.txt", "a+" );
        fprintf( pTable, "%s ",  pAig->pName );
        fprintf( pTable, "%d ",  Aig_ManCiNum(pAig)-Aig_ManRegNum(pAig) );
        fprintf( pTable, "%d ",  Aig_ManCoNum(pAig)-Aig_ManRegNum(pAig) );
        fprintf( pTable, "%d ",  Aig_ManRegNum(pAig) );
        fprintf( pTable, "%d ",  Aig_ManNodeNum(pAig) );
        fprintf( pTable, "%d ",  p->nCuts );
        fprintf( pTable, "%d ",  nClausesBeg );
        fprintf( pTable, "%d ",  p->nClauses );
        fprintf( pTable, "%d ",  Iter );
        fprintf( pTable, "%.2f ", (float)(clkInd-clkTotal)/(float)(CLOCKS_PER_SEC) );
        fprintf( pTable, "%.2f ", (float)(Abc_Clock()-clkInd)/(float)(CLOCKS_PER_SEC) );
        fprintf( pTable, "%.2f ", (float)(Abc_Clock()-clkTotal)/(float)(CLOCKS_PER_SEC) );
        fprintf( pTable, "\n" );
        fclose( pTable );
    }
*/
    // clean the manager
    Fra_ClausFree( p );
    return 1;
}